

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O2

bool tinyusdz::prim::anon_unknown_0::ReconstructGPrimProperties
               (Specifier *spec,
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *table,map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *properties,GPrim *gprim,string *warn,string *err,
               bool strict_allowedToken_check)

{
  _Rb_tree_node_base *__lhs;
  TypedAttributeWithFallback<bool> *this;
  TypedAttributeWithFallback<tinyusdz::Orientation> *result;
  TypedAttributeWithFallback<tinyusdz::Purpose> *result_00;
  TypedAttributeWithFallback<tinyusdz::Animatable<tinyusdz::Visibility>_> *result_01;
  uint uVar1;
  string *psVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  __type _Var6;
  int iVar7;
  size_type sVar8;
  value_type_conflict *v;
  _Base_ptr p_Var9;
  ostream *poVar10;
  uint *args;
  Property *prop;
  MaterialBinding *mb;
  Collection *coll;
  char *pcVar11;
  AttrMetas *this_00;
  string *args_1;
  ParseResult ret;
  allocator local_492;
  allocator local_491;
  string *local_490;
  string attr_type_name;
  undefined1 local_438 [32];
  string local_418;
  undefined8 local_3f8;
  storage_union local_3f0;
  function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3e0;
  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3c0;
  function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_3a0;
  ostringstream ss_e;
  storage_t<bool> sStack_37f;
  undefined6 uStack_37e;
  undefined1 local_378 [8];
  code *local_370;
  code *local_368;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar4 = ReconstructXformOpsFromProperties
                    (spec,table,properties,
                     (vector<tinyusdz::XformOp,_std::allocator<tinyusdz::XformOp>_> *)gprim,err);
  if (bVar4) {
    mb = &gprim->super_MaterialBinding;
    if (gprim == (GPrim *)0x0) {
      mb = (MaterialBinding *)0x0;
    }
    bVar4 = ReconstructMaterialBindingProperties(table,properties,mb,err);
    if (bVar4) {
      coll = &gprim->super_Collection;
      if (gprim == (GPrim *)0x0) {
        coll = (Collection *)0x0;
      }
      args = (uint *)warn;
      args_1 = err;
      bVar4 = ReconstructCollectionProperties
                        (table,properties,coll,warn,err,strict_allowedToken_check);
      if (bVar4) {
        p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
        local_3f0._8_8_ = &(properties->_M_t)._M_impl.super__Rb_tree_header;
        this = &gprim->doubleSided;
        local_3f0.dynamic = &(gprim->doubleSided)._paths;
        local_3f8 = &gprim->extent;
        result = &gprim->orientation;
        result_00 = &gprim->purpose;
        result_01 = &gprim->visibility;
        local_490 = warn;
        while( true ) {
          bVar4 = p_Var9 == (_Base_ptr)local_3f0._8_8_;
          if (bVar4) {
            return bVar4;
          }
          __lhs = p_Var9 + 1;
          bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"proxyPrim");
          if (bVar5) break;
LAB_001a1096:
          ::std::__cxx11::string::string((string *)&local_50,(string *)__lhs);
          prop = (Property *)(p_Var9 + 2);
          ::std::__cxx11::string::string((string *)&local_418,"doubleSided",&local_492);
          ret.err._M_dataplus._M_p = (pointer)&ret.err.field_2;
          ret.err._M_string_length = 0;
          ret.err.field_2._M_local_buf[0] = '\0';
          iVar7 = ::std::__cxx11::string::compare((string *)&local_50);
          if (iVar7 == 0) {
            if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
              ret.code = PropertyTypeMismatch;
              ::std::__cxx11::string::string
                        ((string *)&attr_type_name,
                         "Property `{}` must be Attribute, but declared as Relationship.",
                         (allocator *)local_438);
              fmt::format<std::__cxx11::string>
                        ((string *)&ss_e,(fmt *)&attr_type_name,&local_418,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
              ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            Attribute::type_name_abi_cxx11_(&attr_type_name,(Attribute *)prop);
            tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
            _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ss_e,&attr_type_name);
            if (_Var6) {
              ::std::__cxx11::string::_M_dispose();
LAB_001a11d3:
              if (p_Var9[6]._M_left != p_Var9[6]._M_parent) {
                std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                          ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           local_3f0.dynamic,
                           (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                           &p_Var9[6]._M_parent);
                AttrMetas::operator=(&this->_metas,(AttrMetas *)(p_Var9 + 7));
                ::std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_insert_unique<std::__cxx11::string_const&>
                          ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                            *)table,&local_50);
                ret.code = Success;
              }
              iVar7 = *(int *)((long)&p_Var9[0x17]._M_parent + 4);
              if (iVar7 == 1) {
                if (p_Var9[3]._M_color == _S_black) {
                  bVar5 = Attribute::is_blocked((Attribute *)prop);
                  if (bVar5) {
                    (gprim->doubleSided)._blocked = true;
LAB_001a123f:
                    AttrMetas::operator=(&this->_metas,(AttrMetas *)(p_Var9 + 7));
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string_const&>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&local_418);
                    ret.code = Success;
                  }
                  else {
                    bVar5 = primvar::PrimVar::has_value((PrimVar *)&p_Var9[4]._M_parent);
                    if (bVar5) {
                      Attribute::get_value<bool>((Attribute *)local_438);
                      _Var3._M_p = (pointer)_ss_e;
                      ss_e = (ostringstream)local_438[0];
                      if (local_438[0] == (allocator)0x1) {
                        uStack_37e = SUB86(_Var3._M_p,2);
                        sStack_37f = local_438[1];
                        ss_e = (ostringstream)0x1;
                        v = nonstd::optional_lite::optional<bool>::value((optional<bool> *)&ss_e);
                        TypedAttributeWithFallback<bool>::set_value(this,v);
                        goto LAB_001a123f;
                      }
                      ret.code = InternalError;
                    }
                    else {
                      ret.code = VariabilityMismatch;
                    }
                    ::std::__cxx11::string::assign((char *)&ret.err);
                  }
                }
                else {
                  ret.code = VariabilityMismatch;
                  ::std::__cxx11::string::string
                            ((string *)local_438,"Attribute `{}` must be `uniform` variability.",
                             &local_491);
                  fmt::format<std::__cxx11::string>
                            ((string *)&ss_e,(fmt *)local_438,&local_418,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             args);
                  ::std::__cxx11::string::operator=((string *)&ret.err,(string *)&ss_e);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
              }
              else {
                if (iVar7 == 0) {
                  (gprim->doubleSided)._empty = true;
                  goto LAB_001a123f;
                }
                ::std::__cxx11::string::assign((char *)&ret.err);
                ret.code = InternalError;
              }
            }
            else {
              tinyusdz::value::TypeTraits<bool>::underlying_type_name_abi_cxx11_();
              _Var6 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_438,&attr_type_name);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (_Var6) goto LAB_001a11d3;
              ret.code = TypeMismatch;
              ::std::__cxx11::stringstream::stringstream((stringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)&local_370,"Property type mismatch. ");
              poVar10 = ::std::operator<<(poVar10,(string *)&local_418);
              poVar10 = ::std::operator<<(poVar10," expects type `");
              tinyusdz::value::TypeTraits<bool>::type_name_abi_cxx11_();
              poVar10 = ::std::operator<<(poVar10,(string *)local_438);
              poVar10 = ::std::operator<<(poVar10,"` but defined as type `");
              poVar10 = ::std::operator<<(poVar10,(string *)&attr_type_name);
              ::std::operator<<(poVar10,"`");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringbuf::str();
              ::std::__cxx11::string::operator=((string *)&ret.err,(string *)local_438);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss_e);
            }
            ::std::__cxx11::string::_M_dispose();
          }
          else {
            ret.code = Unmatched;
          }
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
          iVar7 = 0;
          if ((ret.code & ~AlreadyProcessed) == Success) {
            iVar7 = 3;
LAB_001a164a:
            bVar5 = false;
          }
          else {
            bVar5 = true;
            if (ret.code != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
              poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
              poVar10 = ::std::operator<<(poVar10,
                                          "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                         );
              poVar10 = ::std::operator<<(poVar10,":");
              poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
              poVar10 = ::std::operator<<(poVar10,"():");
              poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xabe);
              ::std::operator<<(poVar10," ");
              ::std::__cxx11::string::string
                        ((string *)local_438,"Parsing attribute `{}` failed. Error: {}",
                         (allocator *)&local_418);
              args = (uint *)&ret.err;
              fmt::format<char[12],std::__cxx11::string>
                        (&attr_type_name,(fmt *)local_438,(string *)"doubleSided",
                         (char (*) [12])args,args_1);
              poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&attr_type_name);
              ::std::operator<<(poVar10,"\n");
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&attr_type_name,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_438,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)err);
                ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
                ::std::__cxx11::string::_M_dispose();
                ::std::__cxx11::string::_M_dispose();
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
              iVar7 = 1;
              goto LAB_001a164a;
            }
          }
          ::std::__cxx11::string::_M_dispose();
          if (bVar5) {
            bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"visibility");
            if (bVar5) {
              ::std::__cxx11::string::string((string *)&ss_e,"visibility",(allocator *)&ret);
              sVar8 = ::std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::count(table,(string *)&ss_e);
              ::std::__cxx11::string::_M_dispose();
              if (sVar8 == 0) {
                Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
                tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                _Var6 = ::std::operator==((string *)&ss_e,
                                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&ret);
                if ((_Var6) && (uVar1 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar1 < 2)) {
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  if (uVar1 == 0) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xac0);
                    ::std::operator<<(poVar10," ");
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                    poVar10 = ::std::operator<<(poVar10,"visibility");
                    poVar10 = ::std::operator<<(poVar10,
                                                "` token attribute. Set default token value.");
                    ::std::operator<<(poVar10,"\n");
                    psVar2 = local_490;
                    if (local_490 != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&attr_type_name,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)err);
                      ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    pcVar11 = "visibility";
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    this_00 = &result_01->_metas;
LAB_001a1ba9:
                    AttrMetas::operator=(this_00,(AttrMetas *)(p_Var9 + 7));
                    ::std::__cxx11::string::string((string *)&ss_e,pcVar11,(allocator *)&ret);
                    ::std::
                    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    ::_M_insert_unique<std::__cxx11::string>
                              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                *)table,(string *)&ss_e);
                    ::std::__cxx11::string::_M_dispose();
                    goto LAB_001a2081;
                  }
                }
                else {
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                }
                local_378 = (undefined1  [8])0x0;
                _ss_e = VisibilityEnumHandler;
                local_368 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_invoke;
                local_370 = ::std::
                            _Function_handler<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            ::_M_manager;
                ::std::__cxx11::string::string
                          ((string *)&ret,"visibility",(allocator *)&attr_type_name);
                ::std::
                function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                ::function(&local_3a0,
                           (function<nonstd::expected_lite::expected<tinyusdz::Visibility,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)&ss_e);
                args_1 = (string *)result_01;
                bVar5 = ParseTimeSampledEnumProperty<tinyusdz::Visibility,tinyusdz::Visibility>
                                  ((string *)&ret,strict_allowedToken_check,&local_3a0,
                                   (Attribute *)prop,result_01,local_490,err);
                if ((optional<unsigned_int>)local_3a0.super__Function_base._M_manager !=
                    (optional<unsigned_int>)0x0) {
                  (*local_3a0.super__Function_base._M_manager)(&local_3a0,&local_3a0,3);
                }
                ::std::__cxx11::string::_M_dispose();
                iVar7 = 1;
                if (bVar5) {
                  AttrMetas::operator=(&result_01->_metas,(AttrMetas *)(p_Var9 + 7));
                  pcVar11 = "visibility";
LAB_001a2037:
                  ::std::__cxx11::string::string
                            ((string *)&ret,pcVar11,(allocator *)&attr_type_name);
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&ret);
                  ::std::__cxx11::string::_M_dispose();
                  iVar7 = 3;
                }
LAB_001a205a:
                args = (uint *)prop;
                if (local_370 != (code *)0x0) {
                  (*local_370)((string *)&ss_e,(string *)&ss_e,3);
                  args = (uint *)prop;
                }
                goto LAB_001a2072;
              }
            }
            else {
              bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"purpose");
              if (bVar5) {
                ::std::__cxx11::string::string((string *)&ss_e,"purpose",(allocator *)&ret);
                sVar8 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(table,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                if (sVar8 == 0) {
                  Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
                  tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                  _Var6 = ::std::operator==((string *)&ss_e,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret);
                  if ((_Var6) && (uVar1 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar1 < 2))
                  {
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (uVar1 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xac2);
                      ::std::operator<<(poVar10," ");
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                      poVar10 = ::std::operator<<(poVar10,"purpose");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "` token attribute. Set default token value.");
                      ::std::operator<<(poVar10,"\n");
                      psVar2 = local_490;
                      if (local_490 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&attr_type_name,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)err);
                        ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      pcVar11 = "purpose";
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      this_00 = &result_00->_metas;
                      goto LAB_001a1ba9;
                    }
                  }
                  else {
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  local_378 = (undefined1  [8])0x0;
                  _ss_e = PurposeEnumHandler;
                  local_368 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                  local_370 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_manager;
                  ::std::__cxx11::string::string
                            ((string *)&ret,"purpose",(allocator *)&attr_type_name);
                  ::std::
                  function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function(&local_3c0,
                             (function<nonstd::expected_lite::expected<tinyusdz::Purpose,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&ss_e);
                  args_1 = (string *)result_00;
                  bVar5 = ParseUniformEnumProperty<tinyusdz::Purpose,tinyusdz::Purpose>
                                    ((string *)&ret,strict_allowedToken_check,&local_3c0,
                                     (Attribute *)prop,result_00,local_490,err);
                  if ((pointer)local_3c0.super__Function_base._M_manager != (pointer)0x0) {
                    (*local_3c0.super__Function_base._M_manager)(&local_3c0,&local_3c0,3);
                  }
                  ::std::__cxx11::string::_M_dispose();
                  iVar7 = 1;
                  if (bVar5) {
                    AttrMetas::operator=(&result_00->_metas,(AttrMetas *)(p_Var9 + 7));
                    pcVar11 = "purpose";
                    goto LAB_001a2037;
                  }
                  goto LAB_001a205a;
                }
              }
              else {
                bVar5 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)__lhs,"orientation");
                if (!bVar5) {
                  ::std::__cxx11::string::string((string *)&local_70,(string *)__lhs);
                  ::std::__cxx11::string::string
                            ((string *)&ss_e,"extent",(allocator *)&attr_type_name);
                  args_1 = (string *)&ss_e;
                  ParseExtentAttribute
                            (&ret,table,&local_70,prop,(string *)&ss_e,
                             (TypedAttribute<tinyusdz::Animatable<tinyusdz::Extent>_> *)local_3f8);
                  ::std::__cxx11::string::_M_dispose();
                  ::std::__cxx11::string::_M_dispose();
                  iVar7 = 3;
                  if (((ret.code & ~AlreadyProcessed) != Success) &&
                     (iVar7 = 0, ret.code != Unmatched)) {
                    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                    poVar10 = ::std::operator<<(poVar10,
                                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                               );
                    poVar10 = ::std::operator<<(poVar10,":");
                    poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
                    poVar10 = ::std::operator<<(poVar10,"():");
                    poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xac5);
                    ::std::operator<<(poVar10," ");
                    ::std::__cxx11::string::string
                              ((string *)local_438,"Parsing attribute `extent` failed. Error: {}",
                               (allocator *)&local_418);
                    fmt::format<std::__cxx11::string>
                              ((string *)&attr_type_name,(fmt *)local_438,(string *)&ret.err,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               prop);
                    poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&attr_type_name);
                    ::std::operator<<(poVar10,"\n");
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (err != (string *)0x0) {
                      ::std::__cxx11::stringbuf::str();
                      ::std::operator+((string *)&attr_type_name,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_438,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)err);
                      ::std::__cxx11::string::operator=((string *)err,(string *)&attr_type_name);
                      ::std::__cxx11::string::_M_dispose();
                      ::std::__cxx11::string::_M_dispose();
                    }
                    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                    iVar7 = 1;
                  }
                  ::std::__cxx11::string::_M_dispose();
                  args = (uint *)prop;
                  goto LAB_001a2072;
                }
                ::std::__cxx11::string::string((string *)&ss_e,"orientation",(allocator *)&ret);
                sVar8 = ::std::
                        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::count(table,(string *)&ss_e);
                ::std::__cxx11::string::_M_dispose();
                if (sVar8 == 0) {
                  Property::value_type_name_abi_cxx11_((string *)&ss_e,prop);
                  tinyusdz::value::TypeTraits<tinyusdz::Token>::type_name_abi_cxx11_();
                  _Var6 = ::std::operator==((string *)&ss_e,
                                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&ret);
                  if ((_Var6) && (uVar1 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar1 < 2))
                  {
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                    if (uVar1 == 0) {
                      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"[warn]");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                                 );
                      poVar10 = ::std::operator<<(poVar10,":");
                      poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
                      poVar10 = ::std::operator<<(poVar10,"():");
                      poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xac4);
                      ::std::operator<<(poVar10," ");
                      poVar10 = ::std::operator<<((ostream *)&ss_e,"No value assigned to `");
                      poVar10 = ::std::operator<<(poVar10,"orientation");
                      poVar10 = ::std::operator<<(poVar10,
                                                  "` token attribute. Set default token value.");
                      ::std::operator<<(poVar10,"\n");
                      psVar2 = local_490;
                      if (local_490 != (string *)0x0) {
                        ::std::__cxx11::stringbuf::str();
                        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&ret,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)&attr_type_name,
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)err);
                        ::std::__cxx11::string::operator=((string *)psVar2,(string *)&ret);
                        ::std::__cxx11::string::_M_dispose();
                        ::std::__cxx11::string::_M_dispose();
                      }
                      pcVar11 = "orientation";
                      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
                      this_00 = &result->_metas;
                      goto LAB_001a1ba9;
                    }
                  }
                  else {
                    ::std::__cxx11::string::_M_dispose();
                    ::std::__cxx11::string::_M_dispose();
                  }
                  local_378 = (undefined1  [8])0x0;
                  _ss_e = OrientationEnumHandler;
                  local_368 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_invoke;
                  local_370 = ::std::
                              _Function_handler<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              ::_M_manager;
                  ::std::__cxx11::string::string
                            ((string *)&ret,"orientation",(allocator *)&attr_type_name);
                  ::std::
                  function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  ::function(&local_3e0,
                             (function<nonstd::expected_lite::expected<tinyusdz::Orientation,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&ss_e);
                  args_1 = (string *)result;
                  bVar5 = ParseUniformEnumProperty<tinyusdz::Orientation,tinyusdz::Orientation>
                                    ((string *)&ret,strict_allowedToken_check,&local_3e0,
                                     (Attribute *)prop,result,local_490,err);
                  if ((pointer)local_3e0.super__Function_base._M_manager != (pointer)0x0) {
                    (*local_3e0.super__Function_base._M_manager)(&local_3e0,&local_3e0,3);
                  }
                  ::std::__cxx11::string::_M_dispose();
                  iVar7 = 1;
                  if (bVar5) {
                    AttrMetas::operator=(&result->_metas,(AttrMetas *)(p_Var9 + 7));
                    pcVar11 = "orientation";
                    goto LAB_001a2037;
                  }
                  goto LAB_001a205a;
                }
              }
            }
          }
          else {
LAB_001a2072:
            if ((iVar7 != 3) && (iVar7 != 0)) {
              return bVar4;
            }
          }
LAB_001a2081:
          p_Var9 = (_Base_ptr)::std::_Rb_tree_increment(p_Var9);
        }
        ::std::__cxx11::string::string((string *)&ss_e,"proxyPrim",(allocator *)&ret);
        sVar8 = ::std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(table,(key_type *)&ss_e);
        ::std::__cxx11::string::_M_dispose();
        if (sVar8 != 0) goto LAB_001a2081;
        if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) == 0x200000000) {
          if (*(uint *)&p_Var9[0x17]._M_left < 4) {
            args = &switchD_001a1062::switchdataD_002e65d0;
            switch(*(uint *)&p_Var9[0x17]._M_left) {
            default:
              RelationshipProperty::RelationshipProperty
                        ((RelationshipProperty *)&ss_e,(Relationship *)&p_Var9[0x17]._M_left);
              RelationshipProperty::operator=(&gprim->proxyPrim,(RelationshipProperty *)&ss_e);
              Relationship::~Relationship((Relationship *)local_378);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs);
              goto LAB_001a1096;
            case 1:
              goto switchD_001a1062_caseD_1;
            case 2:
              if ((long)p_Var9[0x1e]._M_left - (long)p_Var9[0x1e]._M_parent != 0xd0) {
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
                poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
                poVar10 = ::std::operator<<(poVar10,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                           );
                poVar10 = ::std::operator<<(poVar10,":");
                poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
                poVar10 = ::std::operator<<(poVar10,"():");
                poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xabd);
                ::std::operator<<(poVar10," ");
                pcVar11 = "`{}` target is empty or has mutiple Paths. Must be single Path.";
                goto LAB_001a211e;
              }
switchD_001a1062_caseD_1:
              RelationshipProperty::RelationshipProperty
                        ((RelationshipProperty *)&ss_e,(Relationship *)&p_Var9[0x17]._M_left);
              RelationshipProperty::operator=(&gprim->proxyPrim,(RelationshipProperty *)&ss_e);
              Relationship::~Relationship((Relationship *)local_378);
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)table,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)__lhs);
            }
            goto LAB_001a2081;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xabd);
          ::std::operator<<(poVar10," ");
          pcVar11 = "Internal error. Property `{}` is not a valid Relationship.";
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss_e);
          poVar10 = ::std::operator<<((ostream *)&ss_e,"[error]");
          poVar10 = ::std::operator<<(poVar10,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                                     );
          poVar10 = ::std::operator<<(poVar10,":");
          poVar10 = ::std::operator<<(poVar10,"ReconstructGPrimProperties");
          poVar10 = ::std::operator<<(poVar10,"():");
          poVar10 = (ostream *)::std::ostream::operator<<(poVar10,0xabd);
          ::std::operator<<(poVar10," ");
          pcVar11 = "Property `{}` must be a Relationship.";
        }
LAB_001a211e:
        ::std::__cxx11::string::string((string *)&attr_type_name,pcVar11,(allocator *)local_438);
        fmt::format<char_const*>
                  ((string *)&ret,(fmt *)&attr_type_name,(string *)&kProxyPrim,(char **)args);
        poVar10 = ::std::operator<<((ostream *)&ss_e,(string *)&ret);
        ::std::operator<<(poVar10,"\n");
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        if (err != (string *)0x0) {
          ::std::__cxx11::stringbuf::str();
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ret
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &attr_type_name,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)err)
          ;
          ::std::__cxx11::string::operator=((string *)err,(string *)&ret);
          ::std::__cxx11::string::_M_dispose();
          ::std::__cxx11::string::_M_dispose();
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss_e);
      }
    }
  }
  return false;
}

Assistant:

bool ReconstructGPrimProperties(
  const Specifier &spec,
  std::set<std::string> &table, /* inout */
  const std::map<std::string, Property> &properties,
  GPrim *gprim, /* inout */
  std::string *warn,
  std::string *err,
  bool strict_allowedToken_check)
{

  (void)warn;
  if (!prim::ReconstructXformOpsFromProperties(spec, table, properties, &gprim->xformOps, err)) {
    return false;
  }

  if (!prim::ReconstructMaterialBindingProperties(table, properties, gprim, err)) {
    return false;
  }

  if (!prim::ReconstructCollectionProperties(
    table, properties, gprim, warn, err, strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    PARSE_SINGLE_TARGET_PATH_RELATION(table, prop, kProxyPrim, gprim->proxyPrim)
    PARSE_TYPED_ATTRIBUTE(table, prop, "doubleSided", GPrim, gprim->doubleSided)
    PARSE_TIMESAMPLED_ENUM_PROPERTY(table, prop, kVisibility, Visibility, VisibilityEnumHandler, GPrim,
                   gprim->visibility, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "purpose", Purpose, PurposeEnumHandler, GPrim,
                       gprim->purpose, strict_allowedToken_check)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "orientation", Orientation, OrientationEnumHandler, GPrim,
                       gprim->orientation, strict_allowedToken_check)
    PARSE_EXTENT_ATTRIBUTE(table, prop, "extent", GPrim, gprim->extent)
  }

  return true;
}